

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klass_register.cpp
# Opt level: O0

HT_EventKlassId __thiscall
HawkTracer::parser::KlassRegister::get_klass_id(KlassRegister *this,string *name)

{
  bool bVar1;
  __type _Var2;
  element_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [40];
  value_type *klass;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>_>_>
  *__range2;
  lock_guard l;
  string *name_local;
  KlassRegister *this_local;
  
  l._M_device = (mutex_type *)name;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&__range2,&this->_register_mtx);
  __end2 = std::
           unordered_map<unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>_>_>
           ::begin(&this->_register);
  klass = (value_type *)
          std::
          unordered_map<unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>_>_>
          ::end(&this->_register);
  do {
    bVar1 = std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>,_false>
                         *)&klass);
    if (!bVar1) {
      this_local._4_4_ = 0xffffffff;
LAB_00138c48:
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range2);
      return this_local._4_4_;
    }
    local_68._32_8_ =
         std::__detail::
         _Node_const_iterator<std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>,_false,_false>
         ::operator*(&__end2);
    std::
    __shared_ptr_access<HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&((reference)local_68._32_8_)->second);
    EventKlass::get_name_abi_cxx11_((EventKlass *)local_68);
    _Var2 = std::operator==(local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)l._M_device);
    std::__cxx11::string::~string((string *)local_68);
    if (_Var2) {
      this_00 = std::
                __shared_ptr_access<HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)(local_68._32_8_ + 8));
      this_local._4_4_ = EventKlass::get_id(this_00);
      goto LAB_00138c48;
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>,_false,_false>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

HT_EventKlassId KlassRegister::get_klass_id(const std::string& name) const
{
    lock_guard l(_register_mtx);
    for (const auto& klass : _register)
    {
        if (klass.second->get_name() == name)
        {
            return klass.second->get_id();
        }
    }

    return HT_INVALID_KLASS_ID;
}